

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O1

void hprime_final(ssh_hash *h,uint length,void *vout)

{
  uint hashlen;
  uint8_t hashbuf [64];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  
  if (0x40 < length) {
    do {
      (*h->vt->digest)(h,(uchar *)&local_68);
      (*h->vt->free)(h);
      *(undefined8 *)((long)vout + 0x10) = local_58;
      *(undefined8 *)((long)vout + 0x18) = uStack_50;
      *(undefined8 *)vout = local_68;
      *(undefined8 *)((long)vout + 8) = uStack_60;
      vout = (void *)((long)vout + 0x20);
      length = length - 0x20;
      hashlen = 0x40;
      if (length < 0x40) {
        hashlen = length;
      }
      h = blake2b_new_general(hashlen);
      BinarySink_put_data(h->binarysink_,&local_68,0x40);
      smemclr(&local_68,0x40);
    } while (0x40 < length);
  }
  (*h->vt->digest)(h,(uchar *)vout);
  (*h->vt->free)(h);
  return;
}

Assistant:

static void hprime_final(ssh_hash *h, unsigned length, void *vout)
{
    uint8_t *out = (uint8_t *)vout;

    while (length > 64) {
        uint8_t hashbuf[64];
        ssh_hash_final(h, hashbuf);

        memcpy(out, hashbuf, 32);
        out += 32;
        length -= 32;

        h = blake2b_new_general(length > 64 ? 64 : length);
        put_data(h, hashbuf, 64);

        smemclr(hashbuf, sizeof(hashbuf));
    }

    ssh_hash_final(h, out);
}